

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

bool __thiscall GEO::Logger::get_local_value(Logger *this,string *name,string *value)

{
  bool bVar1;
  reference pbVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *it_1;
  iterator __end2;
  iterator __begin2;
  FeatureSet *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *it;
  iterator __end3;
  iterator __begin3;
  FeatureSet *__range3;
  String local_98 [39];
  bool local_71;
  String local_70 [39];
  bool local_49;
  String local_48 [32];
  string *local_28;
  string *value_local;
  string *name_local;
  Logger *this_local;
  
  local_28 = value;
  value_local = name;
  name_local = (string *)this;
  bVar1 = std::operator==(name,"log:quiet");
  if (bVar1) {
    local_49 = is_quiet(this);
    String::to_string<bool>(local_48,&local_49);
    std::__cxx11::string::operator=((string *)local_28,(string *)local_48);
    std::__cxx11::string::~string((string *)local_48);
    this_local._7_1_ = true;
  }
  else {
    bVar1 = std::operator==(value_local,"log:minimal");
    if (bVar1) {
      local_71 = is_minimal(this);
      String::to_string<bool>(local_70,&local_71);
      std::__cxx11::string::operator=((string *)local_28,(string *)local_70);
      std::__cxx11::string::~string((string *)local_70);
      this_local._7_1_ = true;
    }
    else {
      bVar1 = std::operator==(value_local,"log:pretty");
      if (bVar1) {
        __range3._7_1_ = is_pretty(this);
        String::to_string<bool>(local_98,(bool *)((long)&__range3 + 7));
        std::__cxx11::string::operator=((string *)local_28,(string *)local_98);
        std::__cxx11::string::~string((string *)local_98);
        this_local._7_1_ = true;
      }
      else {
        bVar1 = std::operator==(value_local,"log:file_name");
        if (bVar1) {
          std::__cxx11::string::operator=((string *)local_28,(string *)&this->log_file_name_);
          this_local._7_1_ = true;
        }
        else {
          bVar1 = std::operator==(value_local,"log:features");
          if (bVar1) {
            if ((this->log_everything_ & 1U) == 0) {
              std::__cxx11::string::operator=((string *)local_28,"");
              __end3 = std::
                       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::begin(&this->log_features_);
              it = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end(&this->log_features_);
              while (bVar1 = std::operator!=(&__end3,(_Self *)&it), bVar1) {
                pbVar2 = std::
                         _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator*(&__end3);
                lVar3 = std::__cxx11::string::length();
                if (lVar3 != 0) {
                  std::__cxx11::string::operator+=((string *)local_28,';');
                }
                std::__cxx11::string::operator+=((string *)local_28,(string *)pbVar2);
                std::
                _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator++(&__end3);
              }
            }
            else {
              std::__cxx11::string::operator=((string *)local_28,"*");
            }
            this_local._7_1_ = true;
          }
          else {
            bVar1 = std::operator==(value_local,"log:features_exclude");
            if (bVar1) {
              std::__cxx11::string::operator=((string *)local_28,"");
              __end2 = std::
                       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::begin(&this->log_features_exclude_);
              it_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end(&this->log_features_exclude_);
              while (bVar1 = std::operator!=(&__end2,(_Self *)&it_1), bVar1) {
                pbVar2 = std::
                         _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator*(&__end2);
                lVar3 = std::__cxx11::string::length();
                if (lVar3 != 0) {
                  std::__cxx11::string::operator+=((string *)local_28,';');
                }
                std::__cxx11::string::operator+=((string *)local_28,(string *)pbVar2);
                std::
                _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator++(&__end2);
              }
              this_local._7_1_ = true;
            }
            else {
              this_local._7_1_ = false;
            }
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Logger::get_local_value(
        const std::string& name, std::string& value
    ) const {

        if(name == "log:quiet") {
            value = String::to_string(is_quiet());
            return true;
        }

        if(name == "log:minimal") {
            value = String::to_string(is_minimal());
            return true;
        }
        
        if(name == "log:pretty") {
            value = String::to_string(is_pretty());
            return true;
        }

        if(name == "log:file_name") {
            value = log_file_name_;
            return true;
        }

        if(name == "log:features") {
            if(log_everything_) {
                value = "*";
            } else {
                value = "";
                for(auto& it : log_features_) {
                    if(value.length() != 0) {
                        value += ';';
                    }
                    value += it;
                }
            }
            return true;
        }

        if(name == "log:features_exclude") {
            value = "";
            for(auto& it : log_features_exclude_) {
                if(value.length() != 0) {
                    value += ';';
                }
                value += it;
            }
            return true;
        }

        return false;
    }